

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

int __thiscall amrex::FArrayBox::readFrom(FArrayBox *this,istream *is,int compIndex)

{
  FABio *pFVar1;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int remainingComponents;
  FABio *fabrd;
  int nCompAvailable;
  int *in_stack_000000c0;
  int in_stack_000000cc;
  FArrayBox *in_stack_000000d0;
  istream *in_stack_000000d8;
  int local_18;
  
  pFVar1 = FABio::read_header(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                              in_stack_000000c0);
  (*pFVar1->_vptr_FABio[5])(pFVar1,in_RSI,in_RDI,(ulong)in_EDX);
  (*pFVar1->_vptr_FABio[2])(pFVar1,in_RSI,in_RDI);
  (*pFVar1->_vptr_FABio[5])(pFVar1,in_RSI,in_RDI,(ulong)((local_18 - in_EDX) - 1));
  if (pFVar1 != (FABio *)0x0) {
    (*pFVar1->_vptr_FABio[1])();
  }
  return local_18;
}

Assistant:

int
FArrayBox::readFrom (std::istream& is, int compIndex)
{
//    BL_PROFILE("FArrayBox::readFrom_is_i");
    int nCompAvailable;
    FABio* fabrd = FABio::read_header(is, *this, compIndex, nCompAvailable);
    BL_ASSERT(compIndex >= 0 && compIndex < nCompAvailable);

    fabrd->skip(is, *this, compIndex);  // skip data up to the component we want
#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        FArrayBox hostfab(this->box(), 1, The_Pinned_Arena());
        fabrd->read(is, hostfab);
        Gpu::htod_memcpy_async(this->dataPtr(), hostfab.dataPtr(), hostfab.size()*sizeof(Real));
        Gpu::streamSynchronize();
    } else
#endif
    {
        fabrd->read(is, *this);
    }
    int remainingComponents = nCompAvailable - compIndex - 1;
    fabrd->skip(is, *this, remainingComponents);  // skip to the end

    delete fabrd;
    return nCompAvailable;
}